

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_topology.cpp
# Opt level: O1

void Omega_h::mark_dead_ents
               (Mesh *mesh,LOs *rails2edges,Read<signed_char> *rail_col_dirs,Int cell_dim,
               Write<signed_char> *dead_cells,Write<signed_char> *dead_sides)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  undefined4 *puVar10;
  char cVar11;
  uint uVar12;
  bool bVar13;
  Read<signed_char> ec_codes;
  LOs ec2c;
  LOs e2ec;
  type f;
  Adj e2c;
  int local_27c;
  Alloc *local_270;
  int local_268;
  Alloc *local_258;
  Alloc *local_248;
  Alloc *local_238;
  Alloc *local_218;
  void *local_210;
  Alloc *local_208;
  void *local_200;
  Alloc *local_1f8;
  void *local_1f0;
  Alloc *local_1e8;
  void *local_1e0;
  Alloc *local_1d8;
  void *local_1d0;
  Int local_1c8;
  Alloc *local_1c0;
  void *local_1b8;
  int local_1b0;
  Alloc *local_1a8;
  void *local_1a0;
  Alloc *local_198;
  void *local_190;
  Alloc *local_188;
  void *pvStack_180;
  Alloc *local_178;
  void *pvStack_170;
  Alloc *local_168;
  void *pvStack_160;
  Alloc *local_158;
  void *pvStack_150;
  Alloc *local_148;
  void *pvStack_140;
  Int local_138;
  Alloc *local_130;
  void *pvStack_128;
  int local_120;
  Alloc *local_118;
  void *pvStack_110;
  Alloc *local_108;
  void *pvStack_100;
  Adj local_f0;
  Alloc *local_c0;
  void *local_b8;
  Alloc *local_b0;
  void *local_a8;
  Int local_a0;
  Alloc *local_98;
  void *local_90;
  int local_88;
  Alloc *local_80;
  void *local_78;
  Alloc *local_70;
  void *local_68;
  Adj local_60;
  
  Mesh::ask_up(&local_60,mesh,1,cell_dim);
  local_238 = local_60.super_Graph.a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_238 = (Alloc *)((local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count =
           (local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_248 = local_60.super_Graph.ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_248 = (Alloc *)((local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
           (local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_258 = local_60.codes.write_.shared_alloc_.alloc;
  if (((ulong)local_60.codes.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_258 = (Alloc *)((local_60.codes.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_60.codes.write_.shared_alloc_.alloc)->use_count =
           (local_60.codes.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  uVar3 = cell_dim - 1;
  Mesh::ask_down(&local_f0,mesh,cell_dim,uVar3);
  local_1b8 = local_f0.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_270 = local_f0.super_Graph.ab2b.write_.shared_alloc_.alloc;
  if ((((ulong)local_f0.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
       local_f0.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) &&
     (entering_parallel == '\x01')) {
    (local_f0.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
         (local_f0.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + -1;
    local_270 = (Alloc *)((local_f0.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_f0.super_Graph.ab2b.write_.shared_alloc_.alloc = (Alloc *)0x0;
  local_f0.super_Graph.ab2b.write_.shared_alloc_.direct_ptr = (void *)0x0;
  Adj::~Adj(&local_f0);
  switch(cell_dim) {
  case 0:
    local_27c = 1;
    break;
  case 1:
    if (uVar3 == 0) {
      local_27c = 2;
      break;
    }
    bVar13 = uVar3 == 1;
    goto LAB_00261ddc;
  case 2:
    local_27c = 3;
    bVar13 = uVar3 == 2;
    if (uVar3 < 2) break;
LAB_00261ddc:
    local_27c = (uint)bVar13 * 2 + -1;
    break;
  case 3:
    local_27c = 4;
    break;
  default:
    local_27c = -1;
  }
  local_218 = (rails2edges->write_).shared_alloc_.alloc;
  if (((ulong)local_218 & 1) == 0) {
    uVar7 = local_218->size;
  }
  else {
    uVar7 = (ulong)local_218 >> 3;
  }
  if (((ulong)local_218 & 7) == 0 && local_218 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_218 = (Alloc *)(local_218->size * 8 + 1);
    }
    else {
      local_218->use_count = local_218->use_count + 1;
    }
  }
  local_210 = (rails2edges->write_).shared_alloc_.direct_ptr;
  local_208 = (rail_col_dirs->write_).shared_alloc_.alloc;
  if (((ulong)local_208 & 7) == 0 && local_208 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_208 = (Alloc *)(local_208->size * 8 + 1);
    }
    else {
      local_208->use_count = local_208->use_count + 1;
    }
  }
  local_200 = (rail_col_dirs->write_).shared_alloc_.direct_ptr;
  local_1f8 = local_238;
  if (((ulong)local_238 & 7) == 0 && local_238 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1f8 = (Alloc *)(local_238->size * 8 + 1);
    }
    else {
      local_238->use_count = local_238->use_count + 1;
    }
  }
  local_1f0 = local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
  local_1e8 = local_248;
  if (((ulong)local_248 & 7) == 0 && local_248 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1e8 = (Alloc *)(local_248->size * 8 + 1);
    }
    else {
      local_248->use_count = local_248->use_count + 1;
    }
  }
  local_1e0 = local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_1d8 = local_258;
  if (((ulong)local_258 & 7) == 0 && local_258 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1d8 = (Alloc *)(local_258->size * 8 + 1);
    }
    else {
      local_258->use_count = local_258->use_count + 1;
    }
  }
  local_1d0 = local_60.codes.write_.shared_alloc_.direct_ptr;
  local_1c0 = local_270;
  if (((ulong)local_270 & 7) == 0 && local_270 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1c0 = (Alloc *)(local_270->size * 8 + 1);
    }
    else {
      local_270->use_count = local_270->use_count + 1;
    }
  }
  local_1b0 = local_27c;
  local_1a8 = (dead_cells->shared_alloc_).alloc;
  if (((ulong)local_1a8 & 7) == 0 && local_1a8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1a8 = (Alloc *)(local_1a8->size * 8 + 1);
    }
    else {
      local_1a8->use_count = local_1a8->use_count + 1;
    }
  }
  local_1a0 = (dead_cells->shared_alloc_).direct_ptr;
  local_198 = (dead_sides->shared_alloc_).alloc;
  if (((ulong)local_198 & 7) == 0 && local_198 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_198 = (Alloc *)(local_198->size * 8 + 1);
    }
    else {
      local_198->use_count = local_198->use_count + 1;
    }
  }
  local_190 = (dead_sides->shared_alloc_).direct_ptr;
  local_188 = local_218;
  if (((ulong)local_218 & 7) == 0 && local_218 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_188 = (Alloc *)(local_218->size * 8 + 1);
    }
    else {
      local_218->use_count = local_218->use_count + 1;
    }
  }
  local_178 = local_208;
  if (((ulong)local_208 & 7) == 0 && local_208 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_178 = (Alloc *)(local_208->size * 8 + 1);
    }
    else {
      local_208->use_count = local_208->use_count + 1;
    }
  }
  local_168 = local_1f8;
  if (((ulong)local_1f8 & 7) == 0 && local_1f8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_168 = (Alloc *)(local_1f8->size * 8 + 1);
    }
    else {
      local_1f8->use_count = local_1f8->use_count + 1;
    }
  }
  pvStack_160 = local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
  local_158 = local_1e8;
  if (((ulong)local_1e8 & 7) == 0 && local_1e8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_158 = (Alloc *)(local_1e8->size * 8 + 1);
    }
    else {
      local_1e8->use_count = local_1e8->use_count + 1;
    }
  }
  pvStack_150 = local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_148 = local_1d8;
  if (((ulong)local_1d8 & 7) == 0 && local_1d8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_148 = (Alloc *)(local_1d8->size * 8 + 1);
    }
    else {
      local_1d8->use_count = local_1d8->use_count + 1;
    }
  }
  pvStack_140 = local_60.codes.write_.shared_alloc_.direct_ptr;
  local_130 = local_1c0;
  if (((ulong)local_1c0 & 7) == 0 && local_1c0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_130 = (Alloc *)(local_1c0->size * 8 + 1);
    }
    else {
      local_1c0->use_count = local_1c0->use_count + 1;
    }
  }
  pvStack_128 = local_1b8;
  local_120 = local_27c;
  local_118 = local_1a8;
  if (((ulong)local_1a8 & 7) == 0 && local_1a8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_118 = (Alloc *)(local_1a8->size * 8 + 1);
    }
    else {
      local_1a8->use_count = local_1a8->use_count + 1;
    }
  }
  local_108 = local_198;
  if (((ulong)local_198 & 7) == 0 && local_198 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_108 = (Alloc *)(local_198->size * 8 + 1);
    }
    else {
      local_198->use_count = local_198->use_count + 1;
    }
  }
  local_268 = (int)(uVar7 >> 2);
  local_1c8 = cell_dim;
  pvStack_180 = local_210;
  pvStack_170 = local_200;
  local_138 = cell_dim;
  pvStack_110 = local_1a0;
  pvStack_100 = local_190;
  if (0 < local_268) {
    local_f0.super_Graph.a2ab.write_.shared_alloc_.alloc = local_188;
    if (((ulong)local_188 & 7) == 0 && local_188 != (Alloc *)0x0) {
      local_188->use_count = local_188->use_count + -1;
      local_f0.super_Graph.a2ab.write_.shared_alloc_.alloc = (Alloc *)(local_188->size * 8 + 1);
    }
    local_188 = (Alloc *)0x0;
    pvStack_180 = (void *)0x0;
    local_f0.super_Graph.ab2b.write_.shared_alloc_.alloc = local_178;
    if (((ulong)local_178 & 7) == 0 && local_178 != (Alloc *)0x0) {
      local_178->use_count = local_178->use_count + -1;
      local_f0.super_Graph.ab2b.write_.shared_alloc_.alloc = (Alloc *)(local_178->size * 8 + 1);
    }
    local_178 = (Alloc *)0x0;
    pvStack_170 = (void *)0x0;
    local_f0.codes.write_.shared_alloc_.alloc = local_168;
    local_f0.codes.write_.shared_alloc_.direct_ptr =
         local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
    if (((ulong)local_168 & 7) == 0 && local_168 != (Alloc *)0x0) {
      local_168->use_count = local_168->use_count + -1;
      local_f0.codes.write_.shared_alloc_.alloc = (Alloc *)(local_168->size * 8 + 1);
    }
    local_168 = (Alloc *)0x0;
    pvStack_160 = (void *)0x0;
    local_c0 = local_158;
    local_b8 = local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
    if (((ulong)local_158 & 7) == 0 && local_158 != (Alloc *)0x0) {
      local_158->use_count = local_158->use_count + -1;
      local_c0 = (Alloc *)(local_158->size * 8 + 1);
    }
    local_158 = (Alloc *)0x0;
    pvStack_150 = (void *)0x0;
    local_b0 = local_148;
    local_a8 = local_60.codes.write_.shared_alloc_.direct_ptr;
    if (((ulong)local_148 & 7) == 0 && local_148 != (Alloc *)0x0) {
      local_148->use_count = local_148->use_count + -1;
      local_b0 = (Alloc *)(local_148->size * 8 + 1);
    }
    local_148 = (Alloc *)0x0;
    pvStack_140 = (void *)0x0;
    local_98 = local_130;
    local_90 = local_1b8;
    if (((ulong)local_130 & 7) == 0 && local_130 != (Alloc *)0x0) {
      local_130->use_count = local_130->use_count + -1;
      local_98 = (Alloc *)(local_130->size * 8 + 1);
    }
    local_130 = (Alloc *)0x0;
    pvStack_128 = (void *)0x0;
    local_88 = local_27c;
    local_80 = local_118;
    if (((ulong)local_118 & 7) == 0 && local_118 != (Alloc *)0x0) {
      local_118->use_count = local_118->use_count + -1;
      local_80 = (Alloc *)(local_118->size * 8 + 1);
    }
    local_118 = (Alloc *)0x0;
    pvStack_110 = (void *)0x0;
    local_70 = local_108;
    if (((ulong)local_108 & 7) == 0 && local_108 != (Alloc *)0x0) {
      local_108->use_count = local_108->use_count + -1;
      local_70 = (Alloc *)(local_108->size * 8 + 1);
    }
    local_108 = (Alloc *)0x0;
    pvStack_100 = (void *)0x0;
    entering_parallel = '\0';
    lVar5 = 0;
    do {
      lVar6 = (long)*(int *)((long)local_210 + lVar5 * 4);
      iVar2 = *(int *)((long)local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr + lVar6 * 4);
      lVar4 = (long)iVar2;
      if (iVar2 < *(int *)((long)local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr +
                          lVar6 * 4 + 4)) {
        uVar3 = 1 - (int)*(char *)((long)local_200 + lVar5);
        do {
          iVar2 = *(int *)((long)local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr +
                          lVar4 * 4);
          cVar11 = (char)*(byte *)((long)local_60.codes.write_.shared_alloc_.direct_ptr + lVar4) >>
                   3;
          uVar8 = *(byte *)((long)local_60.codes.write_.shared_alloc_.direct_ptr + lVar4) >> 1 & 3;
          uVar12 = uVar3 ^ uVar8;
          uVar7 = 0xffffffff;
          if (cell_dim == 2) {
            if (cVar11 == '\x02') {
switchD_00262622_caseD_2:
              uVar7 = 2;
              if (uVar3 != uVar8) {
                uVar7 = (ulong)-(uint)(uVar12 != 1);
              }
            }
            else {
              if (cVar11 == '\x01') goto switchD_00262622_caseD_1;
              if (cVar11 == '\0') goto switchD_00262622_caseD_0;
            }
            goto switchD_00262622_default;
          }
          if (cell_dim != 3) goto switchD_00262622_default;
          switch(cVar11) {
          case '\0':
switchD_00262622_caseD_0:
            if (uVar3 == uVar8) {
LAB_00262645:
              uVar7 = 0;
            }
            else {
              uVar7 = (ulong)((uint)(uVar12 == 1) * 2 - 1);
            }
            break;
          case '\x01':
switchD_00262622_caseD_1:
            uVar7 = 1;
            if (uVar3 != uVar8) {
              uVar7 = (ulong)((uint)(uVar12 == 1) * 3 - 1);
            }
            break;
          case '\x02':
            goto switchD_00262622_caseD_2;
          case '\x03':
            if (uVar3 == uVar8) goto LAB_00262645;
            goto LAB_002626a0;
          case '\x04':
            uVar7 = 1;
            goto LAB_0026269b;
          case '\x05':
            uVar7 = 2;
LAB_0026269b:
            if (uVar3 != uVar8) {
LAB_002626a0:
              uVar7 = (ulong)((uint)(uVar12 == 1) * 4 - 1);
            }
          }
switchD_00262622_default:
          uVar8 = (uint)uVar7;
          if (cell_dim == 1) {
            iVar9 = 1 - uVar8;
          }
          else {
            iVar9 = -1;
            if (cell_dim == 2) {
              if (uVar8 < 3) {
                puVar10 = &DAT_0044ebc4;
                goto LAB_002626e4;
              }
            }
            else if ((cell_dim == 3) && (uVar8 < 4)) {
              puVar10 = &DAT_00450cf8;
LAB_002626e4:
              iVar9 = puVar10[uVar7];
            }
          }
          iVar9 = *(int *)((long)local_1b8 + (long)(iVar2 * local_27c + iVar9) * 4);
          *(undefined1 *)((long)local_1a0 + (long)iVar2) = 1;
          *(undefined1 *)((long)local_190 + (long)iVar9) = 1;
          lVar4 = lVar4 + 1;
        } while (lVar4 < *(int *)((long)local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr +
                                 lVar6 * 4 + 4));
      }
      lVar5 = lVar5 + 1;
    } while ((int)lVar5 != local_268);
    local_f0.super_Graph.a2ab.write_.shared_alloc_.direct_ptr = local_210;
    local_f0.super_Graph.ab2b.write_.shared_alloc_.direct_ptr = local_200;
    local_a0 = cell_dim;
    local_78 = local_1a0;
    local_68 = local_190;
    mark_dead_ents(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,int,Omega_h::Write<signed_char>&,Omega_h::Write<signed_char>&)
    ::$_0::~__0((__0 *)&local_f0);
  }
  mark_dead_ents(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,int,Omega_h::Write<signed_char>&,Omega_h::Write<signed_char>&)
  ::$_0::~__0((__0 *)&local_188);
  mark_dead_ents(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,int,Omega_h::Write<signed_char>&,Omega_h::Write<signed_char>&)
  ::$_0::~__0((__0 *)&local_218);
  if (((ulong)local_270 & 7) == 0 && local_270 != (Alloc *)0x0) {
    piVar1 = &local_270->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_270);
      operator_delete(local_270,0x48);
    }
  }
  if (((ulong)local_258 & 7) == 0 && local_258 != (Alloc *)0x0) {
    piVar1 = &local_258->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_258);
      operator_delete(local_258,0x48);
    }
  }
  if (((ulong)local_248 & 7) == 0 && local_248 != (Alloc *)0x0) {
    piVar1 = &local_248->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_248);
      operator_delete(local_248,0x48);
    }
  }
  if (((ulong)local_238 & 7) == 0 && local_238 != (Alloc *)0x0) {
    piVar1 = &local_238->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_238);
      operator_delete(local_238,0x48);
    }
  }
  Adj::~Adj(&local_60);
  return;
}

Assistant:

void mark_dead_ents(Mesh* mesh, LOs rails2edges, Read<I8> rail_col_dirs,
    Int cell_dim, Write<I8>& dead_cells, Write<I8>& dead_sides) {
  auto e2c = mesh->ask_up(EDGE, cell_dim);
  auto e2ec = e2c.a2ab;
  auto ec2c = e2c.ab2b;
  auto ec_codes = e2c.codes;
  auto cs2s = mesh->ask_down(cell_dim, cell_dim - 1).ab2b;
  auto nccs = simplex_degree(cell_dim, cell_dim - 1);
  auto nrails = rails2edges.size();
  auto f = OMEGA_H_LAMBDA(LO rail) {
    auto e = rails2edges[rail];
    auto eev_col = rail_col_dirs[rail];
    auto eev_onto = 1 - eev_col;
    for (auto ec = e2ec[e]; ec < e2ec[e + 1]; ++ec) {
      auto c = ec2c[ec];
      auto ec_code = ec_codes[ec];
      auto cce = code_which_down(ec_code);
      auto rot = code_rotation(ec_code);
      auto cev_onto = rot ^ eev_onto;
      auto ccv_onto = simplex_down_template(cell_dim, EDGE, cce, cev_onto);
      auto ccs_opp = simplex_opposite_template(cell_dim, VERT, ccv_onto);
      auto s_opp = cs2s[c * nccs + ccs_opp];
      dead_cells[c] = 1;
      dead_sides[s_opp] = 1;
    }
  };
  parallel_for(nrails, f, "mark_dead_ents");
}